

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  int *piVar13;
  bool bVar14;
  int local_3c;
  
  piVar12 = vArr1->pArray + 1;
  piVar13 = vArr2->pArray + 1;
  iVar8 = vArr1->nSize;
  piVar1 = vArr1->pArray + iVar8;
  iVar11 = vArr2->nSize;
  piVar2 = vArr2->pArray + iVar11;
  vCubeFree->nSize = 0;
  if (iVar11 < 2 || (long)iVar8 < 2) {
    iVar11 = 1;
    local_3c = 0;
    iVar8 = 0;
  }
  else {
    iVar8 = 0;
    iVar11 = 1;
    local_3c = 0;
    do {
      iVar9 = *piVar12;
      iVar3 = *piVar13;
      if (iVar9 == iVar3) {
        piVar12 = piVar12 + 1;
        piVar13 = piVar13 + 1;
        local_3c = local_3c + 1;
      }
      else {
        if (iVar9 < iVar3) {
          if (iVar9 < 0) goto LAB_002ca152;
          piVar12 = piVar12 + 1;
          iVar9 = iVar8 + iVar9 * 2;
        }
        else {
          if (iVar3 < 0) goto LAB_002ca152;
          piVar13 = piVar13 + 1;
          bVar14 = vCubeFree->nSize == 0;
          if (bVar14) {
            iVar11 = 0;
          }
          if (bVar14) {
            iVar8 = 1;
          }
          iVar9 = iVar11 + iVar3 * 2;
        }
        Vec_IntPush(vCubeFree,iVar9);
      }
    } while ((piVar12 < piVar1) && (piVar13 < piVar2));
  }
  for (; piVar12 < piVar1; piVar12 = piVar12 + 1) {
    if (*piVar12 < 0) goto LAB_002ca152;
    Vec_IntPush(vCubeFree,iVar8 + *piVar12 * 2);
  }
  for (; piVar13 < piVar2; piVar13 = piVar13 + 1) {
    if (*piVar13 < 0) {
LAB_002ca152:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(vCubeFree,iVar11 + *piVar13 * 2);
  }
  iVar8 = vCubeFree->nSize;
  if (iVar8 == 3) {
    puVar4 = (uint *)vCubeFree->pArray;
    uVar6 = *puVar4;
    if (((int)uVar6 < 0) || (uVar10 = puVar4[1], (int)uVar10 < 0)) {
LAB_002ca171:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar5 = puVar4[2];
    if (((uVar10 ^ uVar6) & 0x7ffffffe) == 2) {
      if ((int)uVar5 < 0) goto LAB_002ca190;
      vCubeFree->nSize = 2;
      if (((uVar5 ^ uVar6) & 1) == 0) {
        lVar7 = 0;
        do {
          puVar4[lVar7] = puVar4[lVar7 + 1];
          lVar7 = lVar7 + 1;
          iVar8 = vCubeFree->nSize;
        } while (lVar7 < iVar8);
      }
      else {
        lVar7 = 1;
        do {
          puVar4[lVar7] = puVar4[lVar7 + 1];
          lVar7 = lVar7 + 1;
          iVar8 = vCubeFree->nSize;
        } while (lVar7 < iVar8);
      }
    }
    else {
      if ((int)uVar5 < 0) goto LAB_002ca171;
      if (((uVar5 ^ uVar10) & 0x7ffffffe) == 2) {
        Vec_IntDrop(vCubeFree,((uVar10 ^ uVar6) & 1) + 1);
      }
      iVar8 = vCubeFree->nSize;
    }
    if (iVar8 == 2) {
      if (((int)*puVar4 < 0) || ((int)puVar4[1] < 0)) goto LAB_002ca171;
      uVar5 = *puVar4 >> 1;
      uVar6 = puVar4[1] >> 1;
      uVar10 = uVar6;
      if (uVar5 < uVar6) {
        uVar10 = uVar5;
      }
      piVar12 = vCubeFree->pArray;
      *piVar12 = uVar10 * 2;
      if (vCubeFree->nSize < 2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      if (uVar6 < uVar5) {
        uVar6 = uVar5;
      }
      piVar12[1] = uVar6 * 2 + 1;
    }
LAB_002ca121:
    iVar8 = vCubeFree->nSize;
  }
  else {
    if (iVar8 == 1) {
      return -1;
    }
    if (iVar8 == 0) {
      puts("The SOP has duplicated cubes.");
      goto LAB_002ca121;
    }
  }
  if (iVar8 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (-1 < *vCubeFree->pArray) {
    if ((*vCubeFree->pArray & 1U) == 0) {
      return local_3c;
    }
    __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x277,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
  }
LAB_002ca190:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x130,"int Abc_LitIsCompl(int)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = Vec_IntArray( vArr1 ) + 1;  // skip variable ID
    int * pBeg2 = Vec_IntArray( vArr2 ) + 1;  // skip variable ID
    int * pEnd1 = Vec_IntLimit( vArr1 );
    int * pEnd2 = Vec_IntLimit( vArr2 );
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        return -1;
    else if ( Vec_IntSize( vCubeFree ) == 3 )
    {
        int * pArray = Vec_IntArray( vCubeFree ); 

        if ( Abc_Lit2Var( pArray[0] ) == Abc_LitNot( Abc_Lit2Var( pArray[1] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[0] ) == Abc_LitIsCompl( pArray[2] ) )
                Vec_IntDrop( vCubeFree, 0 );
            else
                Vec_IntDrop( vCubeFree, 1 );
        }
        else if ( Abc_Lit2Var( pArray[1] ) == Abc_LitNot( Abc_Lit2Var( pArray[2] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[1] ) == Abc_LitIsCompl( pArray[0] ) )
                Vec_IntDrop( vCubeFree, 1 );
            else
                Vec_IntDrop( vCubeFree, 2 );
        }

        if ( Vec_IntSize( vCubeFree ) == 2 )
        {
            int Lit0 = Abc_Lit2Var( pArray[0] ),
                Lit1 = Abc_Lit2Var( pArray[1] );

            if ( Lit0 > Lit1 )
                ABC_SWAP( int, Lit0, Lit1 );

            Vec_IntWriteEntry( vCubeFree, 0, Abc_Var2Lit( Lit0, 0 ) );
            Vec_IntWriteEntry( vCubeFree, 1, Abc_Var2Lit( Lit1, 1 ) );
        }
    }
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}